

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator_file.c
# Opt level: O2

mpt_metatype * mpt_iterator_filename(char *name)

{
  size_t sVar1;
  FILE *pFVar2;
  mpt_iteratorFile *it;
  int *piVar3;
  
  if (name != (char *)0x0) {
    sVar1 = strlen(name);
    if ((int)sVar1 != 0) {
      pFVar2 = fopen(name,"r");
      if (pFVar2 == (FILE *)0x0) {
        return (mpt_metatype *)0x0;
      }
      it = (mpt_iteratorFile *)malloc((long)(int)sVar1 + 0x61);
      if (it == (mpt_iteratorFile *)0x0) {
        return (mpt_metatype *)0x0;
      }
      fileInit(it);
      it->fd = (FILE *)pFVar2;
      memcpy(it + 1,name,(long)((sVar1 << 0x20) + 0x100000000) >> 0x20);
      it->name = (char *)(it + 1);
      return &it->_mt;
    }
  }
  piVar3 = __errno_location();
  *piVar3 = 0x16;
  return (mpt_metatype *)0x0;
}

Assistant:

extern MPT_INTERFACE(metatype) *mpt_iterator_filename(const char *name)
{
	MPT_STRUCT(iteratorFile) *data;
	FILE *file;
	int len;
	
	if (!name || !(len = strlen(name))) {
		errno = EINVAL;
		return 0;
	}
	if (!(file = fopen(name, "r"))) {
		return 0;
	}
	if (!(data = malloc(sizeof(*data) + len + 1))) {
		return 0;
	}
	fileInit(data);
	data->fd = file;
	data->name = memcpy(data + 1, name, len + 1);
	
	return &data->_mt;
}